

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void __thiscall MutableS2ShapeIndex::ApplyUpdatesThreadSafe(MutableS2ShapeIndex *this)

{
  IndexStatus IVar1;
  pointer pUVar2;
  ostream *poVar3;
  UpdateState *this_00;
  S2LogMessage local_28;
  S2LogMessageVoidify local_11;
  MutableS2ShapeIndex *local_10;
  MutableS2ShapeIndex *this_local;
  
  local_10 = this;
  SpinLock::Lock(&this->lock_);
  IVar1 = std::atomic<MutableS2ShapeIndex::IndexStatus>::load
                    (&this->index_status_,memory_order_relaxed);
  if (IVar1 == FRESH) {
    SpinLock::Unlock(&this->lock_);
  }
  else {
    IVar1 = std::atomic<MutableS2ShapeIndex::IndexStatus>::load
                      (&this->index_status_,memory_order_relaxed);
    if (IVar1 == UPDATING) {
      pUVar2 = std::
               unique_ptr<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
               ::operator->(&this->update_state_);
      pUVar2->num_waiting = pUVar2->num_waiting + 1;
      SpinLock::Unlock(&this->lock_);
      pUVar2 = std::
               unique_ptr<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
               ::operator->(&this->update_state_);
      absl::Mutex::Lock(&pUVar2->wait_mutex);
      SpinLock::Lock(&this->lock_);
      pUVar2 = std::
               unique_ptr<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
               ::operator->(&this->update_state_);
      pUVar2->num_waiting = pUVar2->num_waiting + -1;
      UnlockAndSignal(this);
    }
    else {
      IVar1 = std::atomic::operator_cast_to_IndexStatus((atomic *)&this->index_status_);
      if (IVar1 != STALE) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_28,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
                   ,0x1d9,kFatal,(ostream *)&std::cerr);
        poVar3 = S2LogMessage::stream(&local_28);
        poVar3 = std::operator<<(poVar3,"Check failed: (STALE) == (index_status_) ");
        S2LogMessageVoidify::operator&(&local_11,poVar3);
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
      }
      std::atomic<MutableS2ShapeIndex::IndexStatus>::store
                (&this->index_status_,UPDATING,memory_order_relaxed);
      this_00 = (UpdateState *)operator_new(0x30);
      UpdateState::UpdateState(this_00);
      std::
      unique_ptr<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
      ::reset(&this->update_state_,this_00);
      pUVar2 = std::
               unique_ptr<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
               ::operator->(&this->update_state_);
      absl::Mutex::Lock(&pUVar2->wait_mutex);
      SpinLock::Unlock(&this->lock_);
      ApplyUpdatesInternal(this);
      SpinLock::Lock(&this->lock_);
      std::atomic<MutableS2ShapeIndex::IndexStatus>::store
                (&this->index_status_,FRESH,memory_order_release);
      UnlockAndSignal(this);
    }
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::ApplyUpdatesThreadSafe() {
  lock_.Lock();
  if (index_status_.load(std::memory_order_relaxed) == FRESH) {
    lock_.Unlock();
  } else if (index_status_.load(std::memory_order_relaxed) == UPDATING) {
    // Wait until the updating thread is finished.  We do this by attempting
    // to lock a mutex that is held by the updating thread.  When this mutex
    // is unlocked the index_status_ is guaranteed to be FRESH.
    ++update_state_->num_waiting;
    lock_.Unlock();
    update_state_->wait_mutex.Lock();
    lock_.Lock();
    --update_state_->num_waiting;
    UnlockAndSignal();  // Notify other waiting threads.
  } else {
    S2_DCHECK_EQ(STALE, index_status_);
    index_status_.store(UPDATING, std::memory_order_relaxed);
    // Allocate the extra state needed for thread synchronization.  We keep
    // the spinlock held while doing this, because (1) memory allocation is
    // fast, so the chance of a context switch while holding the lock is low;
    // (2) by far the most common situation is that there is no contention,
    // and this saves an extra lock and unlock step; (3) even in the rare case
    // where there is contention, the main side effect is that some other
    // thread will burn a few CPU cycles rather than sleeping.
    update_state_.reset(new UpdateState);
    // lock_.Lock wait_mutex *before* calling Unlock() to ensure that all other
    // threads will block on it.
    update_state_->wait_mutex.Lock();
    // Release the spinlock before doing any real work.
    lock_.Unlock();
    ApplyUpdatesInternal();
    lock_.Lock();
    // index_status_ can be updated to FRESH only while locked *and* using
    // an atomic store operation, so that MaybeApplyUpdates() can check
    // whether the index is FRESH without acquiring the spinlock.
    index_status_.store(FRESH, std::memory_order_release);
    UnlockAndSignal();  // Notify any waiting threads.
  }
}